

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::CommonFunctionCase::CommonFunctionCase
          (CommonFunctionCase *this,Context *context,char *name,char *description,
          ShaderType shaderType)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CommonFunctionCase_00d0df70;
  this->m_shaderType = shaderType;
  (this->m_spec).version = GLSL_VERSION_300_ES;
  (this->m_spec).inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_spec).inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spec).inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_spec).outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_spec).outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spec).outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_spec).globalDeclarations._M_dataplus._M_p =
       (pointer)&(this->m_spec).globalDeclarations.field_2;
  (this->m_spec).globalDeclarations._M_string_length = 0;
  (this->m_spec).globalDeclarations.field_2._M_local_buf[0] = '\0';
  (this->m_spec).source._M_dataplus._M_p = (pointer)&(this->m_spec).source.field_2;
  (this->m_spec).source._M_string_length = 0;
  (this->m_spec).source.field_2._M_local_buf[0] = '\0';
  this->m_numValues = 100;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_failMsg);
  this->m_executor = (ShaderExecutor *)0x0;
  (this->m_spec).version = GLSL_VERSION_300_ES;
  return;
}

Assistant:

CommonFunctionCase::CommonFunctionCase (Context& context, const char* name, const char* description, glu::ShaderType shaderType)
	: TestCase		(context, name, description)
	, m_shaderType	(shaderType)
	, m_numValues	(100)
	, m_executor	(DE_NULL)
{
	m_spec.version = glu::GLSL_VERSION_300_ES;
}